

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O1

shared_ptr<HawkTracer::client::CallGraph::TreeNode> __thiscall
HawkTracer::client::CallGraph::_add_new_call
          (CallGraph *this,NodeData *node_data,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *parent,
          vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
          *calls)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  __it;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *in_R8;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  __it_00;
  __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
  __it_01;
  long lVar6;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> sVar7;
  string label;
  string *local_78;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *local_70;
  element_type *local_68;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  *local_60;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  peVar1 = (parent->
           super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_60 = calls;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,peVar1,
             (long)&((parent->
                     super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  __it_00._M_current =
       *(pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> **)in_R8;
  ppVar4 = *(pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> **)(in_R8 + 8);
  lVar6 = ((long)ppVar4 - (long)__it_00._M_current >> 3) * -0x5555555555555555 >> 2;
  __it_01._M_current = __it_00._M_current;
  local_78 = (string *)local_50;
  local_58 = in_R8;
  if (0 < lVar6) {
    __it_01._M_current = __it_00._M_current + lVar6 * 4;
    lVar6 = lVar6 + 1;
    local_70 = ppVar4;
    local_68 = (element_type *)this;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
              ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                            *)&local_78,__it_00);
      ppVar4 = local_70;
      this = (CallGraph *)local_68;
      __it._M_current = __it_00._M_current;
      if (bVar3) goto LAB_001116dc;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
              ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                            *)&local_78,__it_00._M_current + 1);
      ppVar4 = local_70;
      this = (CallGraph *)local_68;
      __it._M_current = __it_00._M_current + 1;
      if (bVar3) goto LAB_001116dc;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
              ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                            *)&local_78,__it_00._M_current + 2);
      ppVar4 = local_70;
      this = (CallGraph *)local_68;
      __it._M_current = __it_00._M_current + 2;
      if (bVar3) goto LAB_001116dc;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
              ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                            *)&local_78,__it_00._M_current + 3);
      ppVar4 = local_70;
      this = (CallGraph *)local_68;
      __it._M_current = __it_00._M_current + 3;
      if (bVar3) goto LAB_001116dc;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = ((long)ppVar4 - (long)__it_01._M_current >> 3) * -0x5555555555555555;
  if (lVar6 != 1) {
    __it._M_current = __it_01._M_current;
    if (lVar6 != 2) {
      __it._M_current = ppVar4;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
                  ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                                *)&local_78,__it_01), __it._M_current = __it_01._M_current, bVar3))
      goto LAB_001116dc;
      __it._M_current = __it_01._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
            ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                          *)&local_78,__it);
    if (bVar3) goto LAB_001116dc;
    __it_01._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::$_0>
          ::operator()((_Iter_pred<HawkTracer::client::CallGraph::_add_new_call(HawkTracer::client::CallGraph::NodeData_const&,std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>&)::__0>
                        *)&local_78,__it_01);
  __it._M_current = __it_01._M_current;
  if (!bVar3) {
    __it._M_current = ppVar4;
  }
LAB_001116dc:
  if (__it._M_current == ppVar4) {
    (((_Vector_impl *)&(((element_type *)this)->data).label._M_dataplus)->super__Vector_impl_data).
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<HawkTracer::client::CallGraph::TreeNode,std::allocator<HawkTracer::client::CallGraph::TreeNode>,HawkTracer::client::CallGraph::NodeData_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(((element_type *)this)->data).label._M_string_length,(TreeNode **)this,
               (allocator<HawkTracer::client::CallGraph::TreeNode> *)&local_78,(NodeData *)parent);
    peVar1 = (element_type *)
             (((_Vector_impl *)&(((element_type *)this)->data).label._M_dataplus)->
             super__Vector_impl_data)._M_start;
    (peVar1->parent).
    super___weak_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_60->
         super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->parent).
                super___weak_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(local_60->
                super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish);
    local_78 = (string *)CONCAT44(local_78._4_4_,1);
    std::
    vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,int>>>
    ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,int>
              (local_58,(shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)this,(int *)&local_78
              );
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    peVar1 = ((__it._M_current)->first).
             super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar1->total_duration =
         (long)parent[2].
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi +
         (peVar1->total_duration -
         (long)parent[2].
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    std::__cxx11::string::_M_assign((string *)peVar1);
    p_Var2 = parent[2].
             super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (peVar1->data).start_ts =
         (HT_TimestampNs)
         parent[2].
         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    (peVar1->data).stop_ts = (HT_TimestampNs)p_Var2;
    (__it._M_current)->second = (__it._M_current)->second + 1;
    (((_Vector_impl *)&(((element_type *)this)->data).label._M_dataplus)->super__Vector_impl_data).
    _M_start = (pointer)((__it._M_current)->first).
                        super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    p_Var2 = ((__it._M_current)->first).
             super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    &(((element_type *)this)->data).label._M_string_length)->_M_pi = p_Var2;
    _Var5._M_pi = extraout_RDX;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
    _Var5._M_pi = extraout_RDX_01;
  }
  sVar7.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<HawkTracer::client::CallGraph::TreeNode>)
         sVar7.
         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CallGraph::TreeNode> CallGraph::_add_new_call(const NodeData& node_data,
                                                              const std::shared_ptr<TreeNode>& parent,
                                                              std::vector<std::pair<std::shared_ptr<TreeNode>, int>>& calls)
{
    std::string label = node_data.label;
    auto call = std::find_if(calls.begin(), calls.end(),
            [&label](const std::pair<std::shared_ptr<TreeNode>, int>& call) {
                return call.first->data.label == label;
            });
    if (call != calls.end())
    {
        call->first->total_duration += node_data.get_duration();
        call->first->data = node_data;
        ++call->second;

        return call->first;
    }
    else
    {
        std::shared_ptr<TreeNode> event_node = std::make_shared<TreeNode>(node_data);
        event_node->parent = parent;
        calls.emplace_back(event_node, 1);

        return event_node;
    }
}